

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

int __thiscall
FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
::size(FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>
       *this)

{
  int iVar1;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  *pFVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar4;
  int iVar5;
  int iVar6;
  
  pFVar2 = (this->left_->fadexpr_).expr_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  pFVar4 = (pFVar2->fadexpr_).right_;
  iVar1 = ((*(Fad<double> **)((long)&((pFVar3->fadexpr_).left_)->fadexpr_ + 8))->dx_).num_elts;
  iVar5 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if (iVar5 < iVar1) {
    iVar5 = iVar1;
  }
  iVar1 = (((((pFVar4->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar6 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  if (iVar6 < iVar5) {
    iVar6 = iVar5;
  }
  pFVar4 = (this->right_->fadexpr_).right_;
  iVar1 = (((((pFVar4->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar5 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if (iVar5 < iVar1) {
    iVar5 = iVar1;
  }
  iVar1 = (((((((this->right_->fadexpr_).left_)->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts
  ;
  if (iVar5 < iVar1) {
    iVar5 = iVar1;
  }
  if (iVar5 < iVar6) {
    iVar5 = iVar6;
  }
  return iVar5;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }